

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prod_tests1.cpp
# Opt level: O3

void __thiscall
test::prod_test::iu_PeepClassTest_x_iutest_x_Const_Test::Body
          (iu_PeepClassTest_x_iutest_x_Const_Test *this)

{
  peep_member_object_impl<test::prod_test::ProdClass,_const_int,_true> *in_R9;
  AssertionResult iutest_ar;
  type prod_class_c;
  allocator<char> local_1f1;
  AssertionResult local_1f0;
  AssertionHelper local_1c8;
  undefined1 *local_198;
  undefined1 local_190 [392];
  
  local_198 = s_prod;
  local_190._0_4_ = 0x2a;
  iutest::internal::
  CmpHelperEQ<int,iutest::detail::peep::Peep<test::prod_test::ProdClass,test::prod_test::iu_peep_tag_m_c<test::prod_test::ProdClass>>::peep_member_object_impl<test::prod_test::ProdClass,int_const,true>>
            (&local_1f0,(internal *)"42","prod_class_c",local_190,(int *)&local_198,in_R9);
  if (local_1f0.m_result == false) {
    memset((iu_global_format_stringstream *)local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_190);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,local_1f0.m_message._M_dataplus._M_p,&local_1f1);
    local_1c8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests1.cpp"
    ;
    local_1c8.m_part_result.super_iuCodeMessage.m_line = 200;
    local_1c8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1c8,(Fixed *)local_190,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_190);
    std::ios_base::~ios_base((ios_base *)(local_190 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.m_message._M_dataplus._M_p != &local_1f0.m_message.field_2) {
    operator_delete(local_1f0.m_message._M_dataplus._M_p,
                    local_1f0.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(PeepTest, StaticProtectedPeep)
{
    IUTEST_PEEP_STATIC_GET(ProtectedProdClass, m_y) = 4;
    IUTEST_EXPECT_EQ(4, ProtectedProdClass::GetY());

    IUTEST_EXPECT_EQ(4, IUTEST_PEEP_STATIC_GET(ProtectedProdClass, m_y));
}